

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder_mt.c
# Opt level: O1

lzma_ret stream_encode_mt(void *coder_ptr,lzma_allocator *allocator,uint8_t *in,size_t *in_pos,
                         size_t in_size,uint8_t *out,size_t *out_pos,size_t out_size,
                         lzma_action action)

{
  pthread_mutex_t *__mutex;
  lzma_outq *outq;
  uint uVar1;
  long lVar2;
  int *piVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  _Bool _Var7;
  int iVar8;
  int iVar9;
  lzma_action lVar10;
  lzma_ret lVar11;
  lzma_outbuf *plVar12;
  void *pvVar13;
  lzma_vli lVar14;
  undefined4 *puVar15;
  bool bVar16;
  lzma_action unaff_EBP;
  pthread_mutex_t *ppVar17;
  long lVar18;
  ulong unaff_R14;
  uint8_t *puVar19;
  uint8_t *puVar20;
  mythread_condtime wait_abs;
  lzma_vli uncompressed_size;
  lzma_vli unpadded_size;
  pthread_cond_t *local_140;
  uint8_t *local_138;
  sigset_t old;
  sigset_t local_b0;
  
  local_138 = in;
  switch(*coder_ptr) {
  case 0:
    lzma_bufcpy((uint8_t *)((long)coder_ptr + 0xe8),(size_t *)((long)coder_ptr + 0xf8),0xc,out,
                out_pos,out_size);
    if (*(ulong *)((long)coder_ptr + 0xf8) < 0xc) {
      return LZMA_OK;
    }
    *(undefined8 *)((long)coder_ptr + 0xf8) = 0;
    *(undefined4 *)coder_ptr = 1;
  case 1:
    unpadded_size = 0;
    uncompressed_size = 0;
    __mutex = (pthread_mutex_t *)((long)coder_ptr + 0x168);
    outq = (lzma_outq *)((long)coder_ptr + 0x100);
    bVar6 = false;
LAB_001a2ca9:
    puVar19 = (uint8_t *)CONCAT71((int7)(unaff_R14 >> 8),1);
    unaff_EBP = LZMA_RUN;
    do {
      if ((char)puVar19 == '\0') {
        iVar8 = pthread_mutex_unlock(__mutex);
        if (iVar8 != 0) goto LAB_001a34ce;
      }
      else {
        iVar8 = pthread_mutex_lock(__mutex);
        if (iVar8 != 0) goto LAB_001a34ed;
      }
      if ((char)puVar19 == '\0') {
        if ((unaff_EBP != LZMA_SYNC_FLUSH) ||
           (unaff_EBP = lzma_index_append(*(lzma_index **)((long)coder_ptr + 0x60),allocator,
                                          unpadded_size,uncompressed_size), out_size <= *out_pos))
        break;
      }
      else {
        unaff_EBP = *(lzma_action *)((long)coder_ptr + 0x134);
        if (unaff_EBP == LZMA_RUN) {
          unaff_EBP = lzma_outq_read(outq,out,out_pos,out_size,&unpadded_size,&uncompressed_size);
        }
        else if (unaff_EBP == LZMA_SYNC_FLUSH) {
          __assert_fail("ret != LZMA_STREAM_END",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/common/stream_encoder_mt.c"
                        ,0x2be,
                        "lzma_ret stream_encode_mt(void *, const lzma_allocator *, const uint8_t *restrict, size_t *restrict, size_t, uint8_t *restrict, size_t *restrict, size_t, lzma_action)"
                       );
        }
      }
      puVar19 = (uint8_t *)((ulong)puVar19 ^ 1);
    } while( true );
  case 2:
    goto LAB_001a339e;
  case 3:
    goto switchD_001a2c17_caseD_3;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/common/stream_encoder_mt.c"
                  ,0x343,
                  "lzma_ret stream_encode_mt(void *, const lzma_allocator *, const uint8_t *restrict, size_t *restrict, size_t, uint8_t *restrict, size_t *restrict, size_t, lzma_action)"
                 );
  }
  puVar20 = out;
  if (unaff_EBP != LZMA_RUN) {
    bVar6 = false;
    threads_stop((lzma_stream_coder_conflict1 *)coder_ptr,false);
    goto LAB_001a3395;
  }
  do {
    if ((in_size <= *in_pos) &&
       ((unaff_EBP = LZMA_RUN, action == LZMA_RUN || (*(long *)((long)coder_ptr + 0x150) == 0))))
    break;
    if (*(long *)((long)coder_ptr + 0x150) == 0) {
      if (*(uint *)((long)coder_ptr + 0x120) < *(uint *)((long)coder_ptr + 0x118)) {
        bVar4 = true;
        while( true ) {
          if (bVar4) {
            iVar8 = pthread_mutex_lock(__mutex);
            if (iVar8 != 0) goto LAB_001a34ed;
          }
          else {
            iVar8 = pthread_mutex_unlock(__mutex);
            if (iVar8 != 0) goto LAB_001a34ce;
          }
          if (!bVar4) break;
          lVar2 = *(long *)((long)coder_ptr + 0x148);
          bVar4 = false;
          if (lVar2 != 0) {
            *(long *)((long)coder_ptr + 0x150) = lVar2;
            *(undefined8 *)((long)coder_ptr + 0x148) = *(undefined8 *)(lVar2 + 0x158);
            bVar4 = false;
          }
        }
        if (*(long *)((long)coder_ptr + 0x150) != 0) {
LAB_001a2e02:
          bVar4 = true;
          while( true ) {
            ppVar17 = (pthread_mutex_t *)(*(long *)((long)coder_ptr + 0x150) + 0x160);
            if (bVar4) {
              iVar8 = pthread_mutex_lock(ppVar17);
              if (iVar8 != 0) goto LAB_001a34ed;
            }
            else {
              iVar8 = pthread_mutex_unlock(ppVar17);
              if (iVar8 != 0) goto LAB_001a34ce;
            }
            if (!bVar4) break;
            puVar15 = *(undefined4 **)((long)coder_ptr + 0x150);
            *puVar15 = 1;
            *(undefined8 *)(puVar15 + 4) = 0;
            plVar12 = lzma_outq_get_buf(outq);
            lVar2 = *(long *)((long)coder_ptr + 0x150);
            *(lzma_outbuf **)(lVar2 + 0x18) = plVar12;
            iVar8 = pthread_cond_signal((pthread_cond_t *)(lVar2 + 0x188));
            bVar4 = false;
            if (iVar8 != 0) goto LAB_001a34af;
          }
          goto LAB_001a2e8e;
        }
        if (*(uint *)((long)coder_ptr + 0x144) == *(uint *)((long)coder_ptr + 0x140))
        goto LAB_001a2e8e;
        lVar2 = *(long *)((long)coder_ptr + 0x138);
        lVar18 = (ulong)*(uint *)((long)coder_ptr + 0x144) * 0x1c0;
        pvVar13 = lzma_alloc(*(size_t *)((long)coder_ptr + 8),allocator);
        *(void **)(lVar2 + 8 + lVar18) = pvVar13;
        unaff_EBP = LZMA_FULL_BARRIER|LZMA_SYNC_FLUSH;
        if (pvVar13 == (void *)0x0) {
          bVar4 = false;
        }
        else {
          puVar15 = (undefined4 *)(lVar2 + lVar18);
          iVar8 = pthread_mutex_init((pthread_mutex_t *)(puVar15 + 0x58),(pthread_mutexattr_t *)0x0)
          ;
          if (iVar8 == 0) {
            local_140 = (pthread_cond_t *)(puVar15 + 0x62);
            iVar8 = pthread_cond_init(local_140,(pthread_condattr_t *)0x0);
            if (iVar8 == 0) {
              *puVar15 = 0;
              *(lzma_allocator **)(puVar15 + 10) = allocator;
              *(void **)(puVar15 + 8) = coder_ptr;
              *(undefined8 *)(puVar15 + 0xc) = 0;
              *(undefined8 *)(puVar15 + 0xe) = 0;
              *(undefined8 *)(puVar15 + 0x10) = 0;
              *(undefined8 *)(puVar15 + 0x12) = 0xffffffffffffffff;
              *(undefined8 *)(puVar15 + 0x14) = 0;
              *(undefined8 *)(puVar15 + 0x16) = 0;
              *(undefined8 *)(puVar15 + 0x18) = 0;
              *(undefined8 *)(puVar15 + 0x1a) = 0;
              *(undefined8 *)(puVar15 + 0x1c) = 0;
              *(undefined8 *)(puVar15 + 0x1e) = 0;
              *(undefined8 *)(puVar15 + 0x20) = 0;
              sigfillset(&local_b0);
              iVar8 = pthread_sigmask(2,&local_b0,(__sigset_t *)&old);
              if (iVar8 != 0) {
LAB_001a35a7:
                __assert_fail("ret == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                              ,0x93,
                              "void mythread_sigmask(int, const sigset_t *restrict, sigset_t *restrict)"
                             );
              }
              iVar8 = pthread_create((pthread_t *)(puVar15 + 0x6e),(pthread_attr_t *)0x0,
                                     worker_start,puVar15);
              iVar9 = pthread_sigmask(2,(__sigset_t *)&old,(__sigset_t *)0x0);
              if (iVar9 != 0) goto LAB_001a35a7;
              if (iVar8 == 0) {
                *(int *)((long)coder_ptr + 0x144) = *(int *)((long)coder_ptr + 0x144) + 1;
                *(undefined4 **)((long)coder_ptr + 0x150) = puVar15;
                unaff_EBP = LZMA_RUN;
                bVar4 = true;
                goto LAB_001a316e;
              }
              iVar8 = pthread_cond_destroy(local_140);
              if (iVar8 != 0) {
                __assert_fail("ret == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                              ,0x104,"void mythread_cond_destroy(mythread_cond *)");
              }
            }
            iVar8 = pthread_mutex_destroy((pthread_mutex_t *)(puVar15 + 0x58));
            if (iVar8 != 0) {
              __assert_fail("ret == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                            ,0xbc,"void mythread_mutex_destroy(mythread_mutex *)");
            }
          }
          lzma_free(*(void **)(puVar15 + 2),allocator);
          bVar4 = false;
        }
LAB_001a316e:
        if (bVar4) goto LAB_001a2e02;
      }
      else {
LAB_001a2e8e:
        unaff_EBP = LZMA_RUN;
      }
      puVar20 = (uint8_t *)((ulong)puVar20 & 0xffffffff);
      if (*(long *)((long)coder_ptr + 0x150) == 0) break;
    }
    old.__val[0] = *(unsigned_long *)(*(long *)((long)coder_ptr + 0x150) + 0x10);
    lzma_bufcpy(local_138,in_pos,in_size,*(uint8_t **)(*(long *)((long)coder_ptr + 0x150) + 8),
                old.__val,*(size_t *)((long)coder_ptr + 8));
    bVar4 = true;
    bVar16 = true;
    if (old.__val[0] != *(unsigned_long *)((long)coder_ptr + 8)) {
      bVar16 = *in_pos == in_size && action != LZMA_RUN;
    }
    bVar5 = false;
    while( true ) {
      ppVar17 = (pthread_mutex_t *)(*(long *)((long)coder_ptr + 0x150) + 0x160);
      if (bVar4) {
        iVar8 = pthread_mutex_lock(ppVar17);
        if (iVar8 != 0) goto LAB_001a34ed;
      }
      else {
        iVar8 = pthread_mutex_unlock(ppVar17);
        if (iVar8 != 0) goto LAB_001a34ce;
      }
      if (!bVar4) break;
      piVar3 = *(int **)((long)coder_ptr + 0x150);
      if (*piVar3 == 0) {
        bVar5 = true;
        bVar4 = false;
      }
      else {
        *(unsigned_long *)(piVar3 + 4) = old.__val[0];
        if (bVar16) {
          *piVar3 = 2;
        }
        iVar8 = pthread_cond_signal((pthread_cond_t *)(piVar3 + 0x62));
        bVar4 = false;
        if (iVar8 != 0) {
LAB_001a34af:
          __assert_fail("ret == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                        ,0x10c,"void mythread_cond_signal(mythread_cond *)");
        }
      }
    }
    if (bVar5) {
      bVar4 = true;
      puVar19 = (uint8_t *)((ulong)puVar19 & 0xffffffff);
      while( true ) {
        if (bVar4) {
          iVar8 = pthread_mutex_lock(__mutex);
          if (iVar8 != 0) goto LAB_001a34ed;
        }
        else {
          iVar8 = pthread_mutex_unlock(__mutex);
          if (iVar8 != 0) goto LAB_001a34ce;
        }
        puVar20 = puVar19;
        if (!bVar4) break;
        puVar19 = (uint8_t *)(ulong)*(uint *)((long)coder_ptr + 0x134);
        bVar4 = false;
      }
    }
    else if (bVar16) {
      *(undefined8 *)((long)coder_ptr + 0x150) = 0;
    }
    unaff_EBP = (lzma_action)puVar20;
  } while (!bVar5);
  if (unaff_EBP != LZMA_RUN) {
    bVar6 = false;
    threads_stop((lzma_stream_coder_conflict1 *)coder_ptr,false);
    goto LAB_001a3395;
  }
  unaff_R14 = *in_pos;
  if (unaff_R14 == in_size) {
    unaff_EBP = action;
    if (action == LZMA_RUN) goto LAB_001a3392;
    if (action == LZMA_FULL_BARRIER) {
LAB_001a338d:
      unaff_EBP = LZMA_SYNC_FLUSH;
      goto LAB_001a3392;
    }
    if (*(int *)((long)coder_ptr + 0x120) == 0) {
      if (action == LZMA_FULL_FLUSH) goto LAB_001a338d;
      if (action == LZMA_FINISH) {
        unaff_EBP = lzma_index_encoder_init
                              ((lzma_next_coder *)((long)coder_ptr + 0x68),allocator,
                               *(lzma_index **)((long)coder_ptr + 0x60));
        if (unaff_EBP != LZMA_RUN) goto LAB_001a3392;
        *(undefined4 *)coder_ptr = 2;
        lVar14 = lzma_index_size(*(lzma_index **)((long)coder_ptr + 0x60));
        *(lzma_vli *)((long)coder_ptr + 0x160) = lVar14 + *(long *)((long)coder_ptr + 0x160) + 0xc;
        bVar6 = true;
        goto LAB_001a3395;
      }
    }
  }
  if (*out_pos == out_size) {
    bVar6 = false;
    unaff_EBP = LZMA_RUN;
    goto LAB_001a3395;
  }
  uVar1 = *(uint *)((long)coder_ptr + 0x130);
  if ((uVar1 != 0) && (!bVar6)) {
    wait_abs.tv_sec = (ulong)uVar1 / 1000;
    wait_abs.tv_nsec = (__syscall_slong_t)((uVar1 % 1000) * 1000000);
    gettimeofday((timeval *)&old,(__timezone_ptr_t)0x0);
    wait_abs.tv_sec = wait_abs.tv_sec + old.__val[0];
    wait_abs.tv_nsec = old.__val[1] * 1000 + wait_abs.tv_nsec;
    if (999999999 < wait_abs.tv_nsec) {
      wait_abs.tv_nsec = wait_abs.tv_nsec + -1000000000;
      wait_abs.tv_sec = wait_abs.tv_sec + 1;
    }
    bVar6 = true;
  }
  bVar4 = true;
  bVar16 = false;
LAB_001a328f:
  if (bVar4) {
    iVar8 = pthread_mutex_lock(__mutex);
    if (iVar8 != 0) {
LAB_001a34ed:
      __assert_fail("ret == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                    ,0xc4,"void mythread_mutex_lock(mythread_mutex *)");
    }
  }
  else {
    iVar8 = pthread_mutex_unlock(__mutex);
    if (iVar8 != 0) {
LAB_001a34ce:
      __assert_fail("ret == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                    ,0xcc,"void mythread_mutex_unlock(mythread_mutex *)");
    }
  }
  if (bVar4) {
    while ((((in_size <= unaff_R14 || (*(long *)((long)coder_ptr + 0x148) == 0)) ||
            (*(uint *)((long)coder_ptr + 0x118) <= *(uint *)((long)coder_ptr + 0x120))) &&
           (_Var7 = lzma_outq_is_readable(outq), !_Var7))) {
      bVar4 = false;
      if ((*(int *)((long)coder_ptr + 0x134) != 0) || (bVar16)) goto LAB_001a328f;
      if (*(int *)((long)coder_ptr + 0x130) == 0) {
        iVar8 = pthread_cond_wait((pthread_cond_t *)((long)coder_ptr + 400),__mutex);
        if (iVar8 != 0) {
          __assert_fail("ret == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                        ,0x114,"void mythread_cond_wait(mythread_cond *, mythread_mutex *)");
        }
      }
      else {
        iVar8 = pthread_cond_timedwait
                          ((pthread_cond_t *)((long)coder_ptr + 400),__mutex,(timespec *)&wait_abs);
        if ((iVar8 != 0) && (iVar8 != 0x6e)) {
          __assert_fail("ret == 0 || ret == ETIMEDOUT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                        ,0x11f,
                        "int mythread_cond_timedwait(mythread_cond *, mythread_mutex *, const mythread_condtime *)"
                       );
        }
        bVar16 = iVar8 != 0;
      }
    }
    bVar4 = false;
    goto LAB_001a328f;
  }
  if (bVar16) goto code_r0x001a335a;
  goto LAB_001a2ca9;
code_r0x001a335a:
  unaff_EBP = 0x20;
LAB_001a3392:
  bVar6 = false;
LAB_001a3395:
  if (!bVar6) {
    return unaff_EBP;
  }
LAB_001a339e:
  bVar6 = false;
  lVar10 = (**(code **)((long)coder_ptr + 0x80))
                     (*(undefined8 *)((long)coder_ptr + 0x68),allocator,0,0,0,out,out_pos,out_size,0
                     );
  if (lVar10 == LZMA_SYNC_FLUSH) {
    lVar14 = lzma_index_size(*(lzma_index **)((long)coder_ptr + 0x60));
    *(lzma_vli *)((long)coder_ptr + 0xb8) = lVar14;
    lVar11 = lzma_stream_footer_encode
                       ((lzma_stream_flags *)((long)coder_ptr + 0xb0),
                        (uint8_t *)((long)coder_ptr + 0xe8));
    if (lVar11 == LZMA_OK) {
      *(undefined4 *)coder_ptr = 3;
      bVar6 = true;
      lVar10 = unaff_EBP;
    }
    else {
      bVar6 = false;
      lVar10 = 0xb;
    }
  }
  if (bVar6) {
switchD_001a2c17_caseD_3:
    lzma_bufcpy((uint8_t *)((long)coder_ptr + 0xe8),(size_t *)((long)coder_ptr + 0xf8),0xc,out,
                out_pos,out_size);
    lVar10 = (lzma_action)(0xb < *(ulong *)((long)coder_ptr + 0xf8));
  }
  return lVar10;
}

Assistant:

static lzma_ret
stream_encode_mt(void *coder_ptr, const lzma_allocator *allocator,
		const uint8_t *restrict in, size_t *restrict in_pos,
		size_t in_size, uint8_t *restrict out,
		size_t *restrict out_pos, size_t out_size, lzma_action action)
{
	lzma_stream_coder *coder = coder_ptr;

	switch (coder->sequence) {
	case SEQ_STREAM_HEADER:
		lzma_bufcpy(coder->header, &coder->header_pos,
				sizeof(coder->header),
				out, out_pos, out_size);
		if (coder->header_pos < sizeof(coder->header))
			return LZMA_OK;

		coder->header_pos = 0;
		coder->sequence = SEQ_BLOCK;

	// Fall through

	case SEQ_BLOCK: {
		// Initialized to silence warnings.
		lzma_vli unpadded_size = 0;
		lzma_vli uncompressed_size = 0;
		lzma_ret ret = LZMA_OK;

		// These are for wait_for_work().
		bool has_blocked = false;
		mythread_condtime wait_abs;

		while (true) {
			mythread_sync(coder->mutex) {
				// Check for Block encoder errors.
				ret = coder->thread_error;
				if (ret != LZMA_OK) {
					assert(ret != LZMA_STREAM_END);
					break; // Break out of mythread_sync.
				}

				// Try to read compressed data to out[].
				ret = lzma_outq_read(&coder->outq,
						out, out_pos, out_size,
						&unpadded_size,
						&uncompressed_size);
			}

			if (ret == LZMA_STREAM_END) {
				// End of Block. Add it to the Index.
				ret = lzma_index_append(coder->index,
						allocator, unpadded_size,
						uncompressed_size);

				// If we didn't fill the output buffer yet,
				// try to read more data. Maybe the next
				// outbuf has been finished already too.
				if (*out_pos < out_size)
					continue;
			}

			if (ret != LZMA_OK) {
				// coder->thread_error was set or
				// lzma_index_append() failed.
				threads_stop(coder, false);
				return ret;
			}

			// Try to give uncompressed data to a worker thread.
			ret = stream_encode_in(coder, allocator,
					in, in_pos, in_size, action);
			if (ret != LZMA_OK) {
				threads_stop(coder, false);
				return ret;
			}

			// See if we should wait or return.
			//
			// TODO: LZMA_SYNC_FLUSH and LZMA_SYNC_BARRIER.
			if (*in_pos == in_size) {
				// LZMA_RUN: More data is probably coming
				// so return to let the caller fill the
				// input buffer.
				if (action == LZMA_RUN)
					return LZMA_OK;

				// LZMA_FULL_BARRIER: The same as with
				// LZMA_RUN but tell the caller that the
				// barrier was completed.
				if (action == LZMA_FULL_BARRIER)
					return LZMA_STREAM_END;

				// Finishing or flushing isn't completed until
				// all input data has been encoded and copied
				// to the output buffer.
				if (lzma_outq_is_empty(&coder->outq)) {
					// LZMA_FINISH: Continue to encode
					// the Index field.
					if (action == LZMA_FINISH)
						break;

					// LZMA_FULL_FLUSH: Return to tell
					// the caller that flushing was
					// completed.
					if (action == LZMA_FULL_FLUSH)
						return LZMA_STREAM_END;
				}
			}

			// Return if there is no output space left.
			// This check must be done after testing the input
			// buffer, because we might want to use a different
			// return code.
			if (*out_pos == out_size)
				return LZMA_OK;

			// Neither in nor out has been used completely.
			// Wait until there's something we can do.
			if (wait_for_work(coder, &wait_abs, &has_blocked,
					*in_pos < in_size))
				return LZMA_TIMED_OUT;
		}

		// All Blocks have been encoded and the threads have stopped.
		// Prepare to encode the Index field.
		return_if_error(lzma_index_encoder_init(
				&coder->index_encoder, allocator,
				coder->index));
		coder->sequence = SEQ_INDEX;

		// Update the progress info to take the Index and
		// Stream Footer into account. Those are very fast to encode
		// so in terms of progress information they can be thought
		// to be ready to be copied out.
		coder->progress_out += lzma_index_size(coder->index)
				+ LZMA_STREAM_HEADER_SIZE;
	}

	// Fall through

	case SEQ_INDEX: {
		// Call the Index encoder. It doesn't take any input, so
		// those pointers can be NULL.
		const lzma_ret ret = coder->index_encoder.code(
				coder->index_encoder.coder, allocator,
				NULL, NULL, 0,
				out, out_pos, out_size, LZMA_RUN);
		if (ret != LZMA_STREAM_END)
			return ret;

		// Encode the Stream Footer into coder->buffer.
		coder->stream_flags.backward_size
				= lzma_index_size(coder->index);
		if (lzma_stream_footer_encode(&coder->stream_flags,
				coder->header) != LZMA_OK)
			return LZMA_PROG_ERROR;

		coder->sequence = SEQ_STREAM_FOOTER;
	}

	// Fall through

	case SEQ_STREAM_FOOTER:
		lzma_bufcpy(coder->header, &coder->header_pos,
				sizeof(coder->header),
				out, out_pos, out_size);
		return coder->header_pos < sizeof(coder->header)
				? LZMA_OK : LZMA_STREAM_END;
	}

	assert(0);
	return LZMA_PROG_ERROR;
}